

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O2

void generate<trng::yarn5s>(size_t samples,unsigned_long seed)

{
  int iVar1;
  result_type rVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  yarn5s r;
  
  trng::yarn5s::yarn5s(&r,(parameter_type *)trng::yarn5s::trng0);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"# generator ");
  pcVar4 = trng::yarn5s::name();
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"  seed = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"type: d\n");
  poVar3 = std::operator<<(poVar3,"count: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"numbit: ");
  iVar1 = trng::int_math::log2_ceil<int>(0x7fffa78e);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  while( true ) {
    std::operator<<(poVar3,'\n');
    bVar5 = samples == 0;
    samples = samples - 1;
    if (bVar5) break;
    rVar2 = trng::yarn5s::operator()(&r);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}